

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::AddIncludeDirectory(cmGeneratorTarget *this,string *src,bool before)

{
  cmTarget *this_00;
  string *propertyValue;
  undefined1 local_68 [32];
  const_iterator local_48;
  undefined1 local_30 [31];
  bool before_local;
  string *src_local;
  cmGeneratorTarget *this_local;
  
  this_00 = this->Target;
  local_30[0x17] = before;
  unique0x1000014d = src;
  src_local = (string *)this;
  cmMakefile::GetBacktrace((cmMakefile *)local_30);
  cmTarget::InsertInclude(this_00,src,(cmListFileBacktrace *)local_30,(bool)(local_30[0x17] & 1));
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_30);
  if ((local_30[0x17] & 1) == 0) {
    local_68._24_8_ =
         std::
         vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
         ::end(&this->IncludeDirectoriesEntries);
  }
  else {
    local_68._24_8_ =
         std::
         vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
         ::begin(&this->IncludeDirectoriesEntries);
  }
  __gnu_cxx::
  __normal_iterator<cmGeneratorTarget::TargetPropertyEntry*const*,std::vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>>
  ::__normal_iterator<cmGeneratorTarget::TargetPropertyEntry**>
            ((__normal_iterator<cmGeneratorTarget::TargetPropertyEntry*const*,std::vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>>
              *)&local_48,
             (__normal_iterator<cmGeneratorTarget::TargetPropertyEntry_**,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
              *)(local_68 + 0x18));
  propertyValue = stack0xffffffffffffffe8;
  cmMakefile::GetBacktrace((cmMakefile *)local_68);
  local_68._16_8_ = CreateTargetPropertyEntry(propertyValue,(cmListFileBacktrace *)local_68,true);
  std::
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ::insert(&this->IncludeDirectoriesEntries,local_48,(value_type *)(local_68 + 0x10));
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_68);
  return;
}

Assistant:

void cmGeneratorTarget::AddIncludeDirectory(const std::string& src,
                                            bool before)
{
  this->Target->InsertInclude(src, this->Makefile->GetBacktrace(), before);
  this->IncludeDirectoriesEntries.insert(
    before ? this->IncludeDirectoriesEntries.begin()
           : this->IncludeDirectoriesEntries.end(),
    CreateTargetPropertyEntry(src, this->Makefile->GetBacktrace(), true));
}